

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_coin_selection.cpp
# Opt level: O2

void __thiscall
CoinSelection_SelectCoins_Simple_KnapsackSolver_match_utxo_Test::
CoinSelection_SelectCoins_Simple_KnapsackSolver_match_utxo_Test
          (CoinSelection_SelectCoins_Simple_KnapsackSolver_match_utxo_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0064b7f0;
  return;
}

Assistant:

TEST(CoinSelection, SelectCoins_Simple_KnapsackSolver_match_utxo)
{
  // 39062500 - 1500 - 1800
  Amount target_amount = Amount::CreateBySatoshiAmount(39059200);
  Amount select_value;
  Amount fee;
  Amount tx_fee = Amount::CreateBySatoshiAmount(1500);
  bool use_bnb = false;
  std::vector<Utxo> ret;
  EXPECT_NO_THROW(ret = exp_selection.SelectCoins(
      target_amount, GetBitcoinUtxoList(), exp_filter, GetBitcoinOption(),
      tx_fee, &select_value, &fee, &use_bnb));

  EXPECT_EQ(ret.size(), 1);
  EXPECT_EQ(select_value.GetSatoshiValue(), 39062500);
  EXPECT_EQ(fee.GetSatoshiValue(), 1800);
  if (ret.size() == 1) {
    EXPECT_EQ(ret[0].amount, static_cast<int64_t>(39062500));
  }
  EXPECT_FALSE(use_bnb);
}